

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# default_traits.h
# Opt level: O2

void __thiscall
charls::default_traits<unsigned_short,_charls::quad<unsigned_short>_>::default_traits
          (default_traits<unsigned_short,_charls::quad<unsigned_short>_> *this,
          int32_t arg_maximum_sample_value,int32_t arg_near_lossless,int32_t reset)

{
  int32_t iVar1;
  int iVar2;
  
  this->maximum_sample_value = arg_maximum_sample_value;
  this->near_lossless = arg_near_lossless;
  iVar2 = (arg_maximum_sample_value + arg_near_lossless * 2) / (arg_near_lossless * 2 + 1) + 1;
  this->range = iVar2;
  iVar1 = log2_ceil(iVar2);
  this->quantized_bits_per_pixel = iVar1;
  iVar1 = log2_ceil(this->maximum_sample_value);
  this->bits_per_pixel = iVar1;
  iVar2 = 8;
  if (8 < iVar1) {
    iVar2 = iVar1;
  }
  this->limit = (iVar2 + iVar1) * 2;
  this->reset_threshold = reset;
  return;
}

Assistant:

default_traits(const int32_t arg_maximum_sample_value, const int32_t arg_near_lossless,
                   const int32_t reset = default_reset_value) noexcept :
        maximum_sample_value{arg_maximum_sample_value},
        near_lossless{arg_near_lossless},
        range{compute_range_parameter(maximum_sample_value, near_lossless)},
        quantized_bits_per_pixel{log2_ceil(range)},
        bits_per_pixel{log2_ceil(maximum_sample_value)},
        limit{compute_limit_parameter(bits_per_pixel)},
        reset_threshold{reset}
    {
    }